

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::ResourceQueryBufferLimitCase::iterate
          (ResourceQueryBufferLimitCase *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ProgramSources *sources;
  TestLog *pTVar7;
  TestError *pTVar8;
  MessageBuilder *pMVar9;
  int *local_8b8;
  MessageBuilder local_7c0;
  MessageBuilder local_640;
  MessageBuilder local_4c0;
  int local_33c;
  int iStack_338;
  GLsizei written;
  int params [4];
  int local_31c;
  undefined8 uStack_318;
  int expectedWriteLen;
  GLenum props [3];
  allocator<char> local_2e1;
  string local_2e0;
  ScopedLogSection local_2c0;
  ScopedLogSection section_1;
  int ndx;
  undefined1 local_28a;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  ScopedLogSection local_218;
  ScopedLogSection section;
  GLuint uniformIndex;
  string local_200;
  ShaderSource local_1e0;
  ProgramSources local_1b8;
  undefined1 local_e8 [8];
  ShaderProgram program;
  Functions *gl;
  ResourceQueryBufferLimitCase *this_local;
  char *pcVar6;
  
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  pcVar6 = (char *)CONCAT44(extraout_var,iVar3);
  program.m_program.m_info.linkTimeUs = (deUint64)pcVar6;
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_1b8);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_200,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)
             "${GLSL_VERSION_DECL}\nlayout(local_size_x = 1) in;\nuniform highp int u_uniform;\nwriteonly buffer OutputBufferBlock { highp int b_output_int; };\nvoid main ()\n{\n\tb_output_int = u_uniform;\n}\n"
             ,pcVar6);
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_1e0,&local_200);
  sources = glu::ProgramSources::operator<<(&local_1b8,&local_1e0);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e8,pRVar5,sources);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  glu::ProgramSources::~ProgramSources(&local_1b8);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"Program",&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"Program",&local_261);
  tcu::ScopedLogSection::ScopedLogSection(&local_218,pTVar7,&local_238,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(pTVar7,(ShaderProgram *)local_e8);
  bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_e8);
  if (!bVar2) {
    local_28a = 1;
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_288,"could not build program",&local_289);
    tcu::TestError::TestError(pTVar8,&local_288);
    local_28a = 0;
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_218);
  pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x9a8);
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
  section.m_log._0_4_ = (*pcVar1)(dVar4,0x92e1,"u_uniform");
  dVar4 = (**(code **)(program.m_program.m_info.linkTimeUs + 0x800))();
  glu::checkError(dVar4,"query resource index",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                  ,0x644);
  if ((int)section.m_log != -1) {
    for (section_1.m_log._0_4_ = 0; (int)section_1.m_log < 6;
        section_1.m_log._0_4_ = (int)section_1.m_log + 1) {
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2e0,"QueryToLarger",&local_2e1);
      pcVar6 = iterate::querySizes[(int)section_1.m_log].description;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(props + 2),pcVar6,(allocator<char> *)((long)props + 7));
      tcu::ScopedLogSection::ScopedLogSection(&local_2c0,pTVar7,&local_2e0,(string *)(props + 2));
      std::__cxx11::string::~string((string *)(props + 2));
      std::allocator<char>::~allocator((allocator<char> *)((long)props + 7));
      std::__cxx11::string::~string((string *)&local_2e0);
      std::allocator<char>::~allocator(&local_2e1);
      uStack_318 = 0x930e0000930e;
      props[0] = 0x930e;
      local_31c = de::min<int>(iterate::querySizes[(int)section_1.m_log].bufferSize,
                               iterate::querySizes[(int)section_1.m_log].numProps);
      _iStack_338 = 0xff000000ff;
      params[0] = 0xff;
      params[1] = 0xff;
      local_33c = -1;
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_4c0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<(&local_4c0,(char (*) [10])0x2b85bd5);
      pMVar9 = tcu::MessageBuilder::operator<<
                         (pMVar9,&iterate::querySizes[(int)section_1.m_log].numProps);
      pMVar9 = tcu::MessageBuilder::operator<<
                         (pMVar9,(char (*) [40])" uniform prop(s) to a buffer with size ");
      pMVar9 = tcu::MessageBuilder::operator<<
                         (pMVar9,&iterate::querySizes[(int)section_1.m_log].bufferSize);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [29])". Expecting query to return ")
      ;
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_31c);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [9])" prop(s)");
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_4c0);
      pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x9c8);
      dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
      if ((iterate::querySizes[(int)section_1.m_log].returnLength & 1U) == 0) {
        local_8b8 = (int *)0x0;
      }
      else {
        local_8b8 = &local_33c;
      }
      (*pcVar1)(dVar4,0x92e1,(int)section.m_log,iterate::querySizes[(int)section_1.m_log].numProps,
                &stack0xfffffffffffffce8,iterate::querySizes[(int)section_1.m_log].bufferSize,
                local_8b8,&iStack_338);
      dVar4 = (**(code **)(program.m_program.m_info.linkTimeUs + 0x800))();
      glu::checkError(dVar4,"query program resources",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                      ,0x66d);
      if (((iterate::querySizes[(int)section_1.m_log].returnLength & 1U) == 0) ||
         (local_33c == local_31c)) {
        if ((&iStack_338)[local_31c] != 0xff) {
          pTVar7 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_7c0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (&local_7c0,(char (*) [23])"Error, guard at index ");
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_31c);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (pMVar9,(char (*) [45])" was modified. Was 255 before call, got dec=");
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&iStack_338 + local_31c);
          tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_7c0);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Wrote over buffer size");
        }
      }
      else {
        pTVar7 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_640,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<
                           (&local_640,(char (*) [33])"Error, expected write length of ");
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_31c);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [7])0x2c59494);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_33c);
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_640);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Unexpected write lenght");
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_2c0);
    }
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e8);
    return STOP;
  }
  section_1.m_log._6_1_ = 1;
  pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx,"Uniform u_uniform resource index was GL_INVALID_INDEX",
             (allocator<char> *)((long)&section_1.m_log + 7));
  tcu::TestError::TestError(pTVar8,(string *)&ndx);
  section_1.m_log._6_1_ = 0;
  __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

ResourceQueryBufferLimitCase::IterateResult ResourceQueryBufferLimitCase::iterate (void)
{
	static const char* const computeSource =	"${GLSL_VERSION_DECL}\n"
												"layout(local_size_x = 1) in;\n"
												"uniform highp int u_uniform;\n"
												"writeonly buffer OutputBufferBlock { highp int b_output_int; };\n"
												"void main ()\n"
												"{\n"
												"	b_output_int = u_uniform;\n"
												"}\n";

	const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
	const glu::ShaderProgram	program			(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(specializeShader(m_context, computeSource)));
	glw::GLuint					uniformIndex;

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// Log program
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Program", "Program");

		m_testCtx.getLog() << program;
		if (!program.isOk())
			throw tcu::TestError("could not build program");
	}

	uniformIndex = gl.getProgramResourceIndex(program.getProgram(), GL_UNIFORM, "u_uniform");
	GLU_EXPECT_NO_ERROR(gl.getError(), "query resource index");

	if (uniformIndex == GL_INVALID_INDEX)
		throw tcu::TestError("Uniform u_uniform resource index was GL_INVALID_INDEX");

	// Query uniform properties

	{
		static const struct
		{
			const char*	description;
			int			numProps;
			int			bufferSize;
			bool		returnLength;
		} querySizes[] =
		{
			{ "Query to a larger buffer",							2, 3, true	},
			{ "Query to too small a buffer",						3, 2, true	},
			{ "Query to zero sized buffer",							3, 0, true	},
			{ "Query to a larger buffer, null length argument",		2, 3, false	},
			{ "Query to too small a buffer, null length argument",	3, 2, false	},
			{ "Query to zero sized buffer, null length argument",	3, 0, false	},
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(querySizes); ++ndx)
		{
			const tcu::ScopedLogSection		section				(m_testCtx.getLog(), "QueryToLarger", querySizes[ndx].description);
			const glw::GLenum				props[]				= { GL_LOCATION, GL_LOCATION, GL_LOCATION };
			const int						expectedWriteLen	= de::min(querySizes[ndx].bufferSize, querySizes[ndx].numProps);
			int								params[]			= { 255, 255, 255, 255 };
			glw::GLsizei					written				= -1;

			DE_ASSERT(querySizes[ndx].numProps <= DE_LENGTH_OF_ARRAY(props));
			DE_ASSERT(querySizes[ndx].bufferSize < DE_LENGTH_OF_ARRAY(params)); // leave at least one element for overflow detection

			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "Querying " << querySizes[ndx].numProps << " uniform prop(s) to a buffer with size " << querySizes[ndx].bufferSize << ". Expecting query to return " << expectedWriteLen << " prop(s)"
				<< tcu::TestLog::EndMessage;

			gl.getProgramResourceiv(program.getProgram(), GL_UNIFORM, uniformIndex, querySizes[ndx].numProps, props, querySizes[ndx].bufferSize, (querySizes[ndx].returnLength) ? (&written) : (DE_NULL), params);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query program resources");

			if (querySizes[ndx].returnLength && written != expectedWriteLen)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, expected write length of " << expectedWriteLen << ", got " << written << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Unexpected write lenght");
			}
			else if (params[expectedWriteLen] != 255)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, guard at index " << (expectedWriteLen) << " was modified. Was 255 before call, got dec=" << params[expectedWriteLen] << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Wrote over buffer size");
			}
		}
	}

	return STOP;
}